

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O0

void Omega_h::transfer_inherit_swap_tmpl<int>
               (Mesh *old_mesh,Mesh *new_mesh,Int prod_dim,LOs *keys2edges,LOs *keys2prods,
               LOs *prods2new_ents,LOs *same_ents2old_ents,LOs *same_ents2new_ents,TagBase *tagbase)

{
  Int width;
  string *name_00;
  Tag<int> *this;
  Read<int> local_120;
  Read<int> local_110;
  Read<int> local_100;
  Read<int> local_f0;
  Read<int> local_e0;
  Read<int> local_d0;
  undefined1 local_c0 [8];
  Read<int> prod_data;
  Read<int> local_90;
  Write<int> local_80;
  undefined1 local_70 [8];
  Read<int> key_data;
  Read<int> edge_data;
  Int ncomps;
  Tag<int> *old_tag;
  string *name;
  LOs *prods2new_ents_local;
  LOs *keys2prods_local;
  LOs *keys2edges_local;
  Int prod_dim_local;
  Mesh *new_mesh_local;
  Mesh *old_mesh_local;
  
  name_00 = TagBase::name_abi_cxx11_(tagbase);
  this = Mesh::get_tag<int>(old_mesh,1,name_00);
  width = TagBase::ncomps(&this->super_TagBase);
  Tag<int>::array((Tag<int> *)&key_data.write_.shared_alloc_.direct_ptr);
  Read<int>::Read(&local_90,keys2edges);
  Read<int>::Read((Read<int> *)&prod_data.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&key_data.write_.shared_alloc_.direct_ptr);
  unmap<int>((Omega_h *)&local_80,&local_90,(Read<int> *)&prod_data.write_.shared_alloc_.direct_ptr,
             width);
  read<int>((Omega_h *)local_70,&local_80);
  Write<int>::~Write(&local_80);
  Read<int>::~Read((Read<int> *)&prod_data.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_90);
  Read<int>::Read(&local_d0,(Read<int> *)local_70);
  Read<int>::Read(&local_e0,keys2prods);
  expand<int>((Omega_h *)local_c0,&local_d0,&local_e0,width);
  Read<int>::~Read(&local_e0);
  Read<int>::~Read(&local_d0);
  Read<int>::Read(&local_f0,same_ents2old_ents);
  Read<int>::Read(&local_100,same_ents2new_ents);
  Read<int>::Read(&local_110,prods2new_ents);
  Read<int>::Read(&local_120,(Read<int> *)local_c0);
  transfer_common<int>
            (old_mesh,new_mesh,prod_dim,&local_f0,&local_100,&local_110,&this->super_TagBase,
             &local_120);
  Read<int>::~Read(&local_120);
  Read<int>::~Read(&local_110);
  Read<int>::~Read(&local_100);
  Read<int>::~Read(&local_f0);
  Read<int>::~Read((Read<int> *)local_c0);
  Read<int>::~Read((Read<int> *)local_70);
  Read<int>::~Read((Read<int> *)&key_data.write_.shared_alloc_.direct_ptr);
  return;
}

Assistant:

static void transfer_inherit_swap_tmpl(Mesh* old_mesh, Mesh* new_mesh,
    Int prod_dim, LOs keys2edges, LOs keys2prods, LOs prods2new_ents,
    LOs same_ents2old_ents, LOs same_ents2new_ents, TagBase const* tagbase) {
  auto const& name = tagbase->name();
  auto old_tag = old_mesh->get_tag<T>(EDGE, name);
  auto ncomps = old_tag->ncomps();
  auto edge_data = old_tag->array();
  auto key_data = read(unmap(keys2edges, edge_data, ncomps));
  auto prod_data = expand(key_data, keys2prods, ncomps);
  transfer_common(old_mesh, new_mesh, prod_dim, same_ents2old_ents,
      same_ents2new_ents, prods2new_ents, old_tag, prod_data);
}